

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

NodeId __thiscall
optimization::common_expr_del::BlockNodes::query_nodeId
          (BlockNodes *this,Op op,
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *operands)

{
  uint32_t uVar1;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  Node node;
  _Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
  in_stack_fffffffffffffec8;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  Node local_118;
  
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_130,in_RDX);
  Node::Node(&local_118,
             (Op)in_stack_fffffffffffffec8.
                 super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 .
                 super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
             ,operands);
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_130);
  pmVar3 = std::
           map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](&this->node_map,&local_118);
  uVar1 = pmVar3->id;
  std::__detail::__variant::
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_118.refVal);
  std::
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::~_Rb_tree(&local_118.parents._M_t);
  while (local_118.local_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
         _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_118.local_vars)
  {
    p_Var2 = (local_118.local_vars.
              super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_118.local_vars.
                    super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    _M_node.super__List_node_base._M_next,0x20);
    local_118.local_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var2;
  }
  while (local_118.live_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
         _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_118.live_vars) {
    p_Var2 = (local_118.live_vars.
              super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_118.live_vars.
                    super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    _M_node.super__List_node_base._M_next,0x20);
    local_118.live_vars.super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var2;
  }
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_118.operands);
  return (NodeId)uVar1;
}

Assistant:

NodeId query_nodeId(Op op, std::vector<Operand> operands) {
    Node node(op, operands);

    NodeId nodeId(node_map[node]);
    return nodeId;
  }